

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

int __thiscall rr::LineExitDiamondGenerator::init(LineExitDiamondGenerator *this,EVP_PKEY_CTX *ctx)

{
  deInt32 dVar1;
  deInt64 dVar2;
  deInt64 dVar3;
  deInt64 dVar4;
  deInt64 y;
  long lVar5;
  deInt64 dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  Vector<float,_4> *in_RDX;
  float fVar11;
  deInt64 yMax;
  deInt64 yMin;
  deInt64 xMax;
  deInt64 xMin;
  deInt64 y1;
  deInt64 x1;
  deInt64 y0;
  deInt64 x0;
  Vec4 *v1_local;
  Vec4 *v0_local;
  LineExitDiamondGenerator *this_local;
  
  fVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)ctx);
  dVar2 = toSubpixelCoord(fVar11);
  fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)ctx);
  dVar3 = toSubpixelCoord(fVar11);
  fVar11 = tcu::Vector<float,_4>::x(in_RDX);
  dVar4 = toSubpixelCoord(fVar11);
  fVar11 = tcu::Vector<float,_4>::y(in_RDX);
  y = toSubpixelCoord(fVar11);
  lVar5 = de::min<long>(dVar2,dVar4);
  dVar6 = toSubpixelCoord(1);
  lVar7 = de::max<long>(dVar2,dVar4);
  dVar2 = toSubpixelCoord(1);
  lVar8 = de::min<long>(dVar3,y);
  dVar4 = toSubpixelCoord(1);
  lVar9 = de::max<long>(dVar3,y);
  dVar3 = toSubpixelCoord(1);
  dVar1 = floorSubpixelToPixelCoord(lVar5 - dVar6,true);
  piVar10 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
  *piVar10 = dVar1;
  dVar1 = floorSubpixelToPixelCoord(lVar8 - dVar4,true);
  piVar10 = tcu::Vector<int,_2>::y(&this->m_bboxMin);
  *piVar10 = dVar1;
  dVar1 = ceilSubpixelToPixelCoord(lVar7 + dVar2,true);
  piVar10 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
  *piVar10 = dVar1;
  dVar1 = ceilSubpixelToPixelCoord(lVar9 + dVar3,true);
  piVar10 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
  *piVar10 = dVar1;
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX->m_data;
  *(undefined8 *)((this->m_v1).m_data + 2) = *(undefined8 *)(in_RDX->m_data + 2);
  *(undefined8 *)(this->m_curPos).m_data = *(undefined8 *)(this->m_bboxMin).m_data;
  return (int)this;
}

Assistant:

void LineExitDiamondGenerator::init (const tcu::Vec4& v0, const tcu::Vec4& v1)
{
	const deInt64					x0				= toSubpixelCoord(v0.x());
	const deInt64					y0				= toSubpixelCoord(v0.y());
	const deInt64					x1				= toSubpixelCoord(v1.x());
	const deInt64					y1				= toSubpixelCoord(v1.y());

	// line endpoints might be perturbed, add some margin
	const deInt64					xMin			= de::min(x0, x1) - toSubpixelCoord(1);
	const deInt64					xMax			= de::max(x0, x1) + toSubpixelCoord(1);
	const deInt64					yMin			= de::min(y0, y1) - toSubpixelCoord(1);
	const deInt64					yMax			= de::max(y0, y1) + toSubpixelCoord(1);

	m_bboxMin.x() = floorSubpixelToPixelCoord(xMin, true);
	m_bboxMin.y() = floorSubpixelToPixelCoord(yMin, true);
	m_bboxMax.x() = ceilSubpixelToPixelCoord (xMax, true);
	m_bboxMax.y() = ceilSubpixelToPixelCoord (yMax, true);

	m_v0 = v0;
	m_v1 = v1;

	m_curPos = m_bboxMin;
}